

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  uint *puVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  long lVar10;
  Real a;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_158;
  uint local_108 [2];
  uint auStack_100 [2];
  uint local_f8 [2];
  uint auStack_f0 [2];
  uint local_e8 [2];
  uint auStack_e0 [2];
  uint local_d8 [2];
  uint auStack_d0 [2];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  iVar4 = rhs->memused;
  *(undefined4 *)(this + 8) = 0;
  if (0 < (long)iVar4) {
    lVar14 = 0;
    do {
      pNVar9 = rhs->m_elem;
      iVar5 = *(int *)((long)(&pNVar9->val + 1) + lVar14);
      puVar2 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14);
      local_c8 = *puVar2;
      uStack_c0 = puVar2[1];
      puVar2 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x10);
      local_b8 = *puVar2;
      uStack_b0 = puVar2[1];
      puVar2 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x20);
      local_a8 = *puVar2;
      uStack_a0 = puVar2[1];
      puVar2 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x30);
      local_98 = *puVar2;
      uStack_90 = puVar2[1];
      iVar6 = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar14);
      cVar3 = *(char *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar14 + 4);
      fVar7 = *(fpclass_type *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar14 + 8);
      iVar8 = *(int32_t *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar14 + 0xc);
      puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14);
      local_108 = *(uint (*) [2])puVar1;
      auStack_100 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x10);
      local_f8 = *(uint (*) [2])puVar1;
      auStack_f0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x20);
      local_e8 = *(uint (*) [2])puVar1;
      auStack_e0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x30);
      local_d8 = *(uint (*) [2])puVar1;
      auStack_d0 = *(uint (*) [2])(puVar1 + 2);
      a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      local_158.data._M_elems[0xc] = local_d8[0];
      local_158.data._M_elems[0xd] = local_d8[1];
      local_158.data._M_elems[0xe] = auStack_d0[0];
      local_158.data._M_elems[0xf] = auStack_d0[1];
      local_158.data._M_elems[8] = local_e8[0];
      local_158.data._M_elems[9] = local_e8[1];
      local_158.data._M_elems[10] = auStack_e0[0];
      local_158.data._M_elems[0xb] = auStack_e0[1];
      local_158.data._M_elems[4] = local_f8[0];
      local_158.data._M_elems[5] = local_f8[1];
      local_158.data._M_elems[6] = auStack_f0[0];
      local_158.data._M_elems[7] = auStack_f0[1];
      local_158.data._M_elems[0] = local_108[0];
      local_158.data._M_elems[1] = local_108[1];
      uVar11 = local_158.data._M_elems._0_8_;
      local_158.data._M_elems[2] = auStack_100[0];
      local_158.data._M_elems[3] = auStack_100[1];
      local_158.neg = (bool)cVar3;
      if ((cVar3 == '\x01') &&
         (local_158.data._M_elems[0] = local_108[0],
         local_158.data._M_elems[0] != 0 || fVar7 != cpp_dec_float_finite)) {
        local_158.neg = false;
      }
      local_158.data._M_elems._0_8_ = uVar11;
      local_158.exp = iVar6;
      local_158.fpclass = fVar7;
      local_158.prec_elem = iVar8;
      if ((fVar7 == cpp_dec_float_NaN) || (NAN(a))) {
LAB_003e9d90:
        lVar10 = *(long *)(this + 0x20);
        lVar13 = (long)iVar5 * 0x50;
        puVar2 = (undefined8 *)(lVar10 + 0x30 + lVar13);
        *puVar2 = local_98;
        puVar2[1] = uStack_90;
        puVar2 = (undefined8 *)(lVar10 + 0x20 + lVar13);
        *puVar2 = local_a8;
        puVar2[1] = uStack_a0;
        puVar2 = (undefined8 *)(lVar10 + 0x10 + lVar13);
        *puVar2 = local_b8;
        puVar2[1] = uStack_b0;
        *(undefined8 *)(lVar10 + lVar13) = local_c8;
        ((undefined8 *)(lVar10 + lVar13))[1] = uStack_c0;
        *(int *)(lVar10 + 0x40 + lVar13) = iVar6;
        *(char *)(lVar10 + 0x44 + lVar13) = cVar3;
        *(fpclass_type *)(lVar10 + 0x48 + lVar13) = fVar7;
        *(int32_t *)(lVar10 + 0x4c + lVar13) = iVar8;
        iVar6 = *(int *)(this + 8);
        *(int *)(this + 8) = iVar6 + 1;
        *(int *)(*(long *)(this + 0x10) + (long)iVar6 * 4) = iVar5;
      }
      else {
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_88,a);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_158,&local_88);
        if (0 < iVar12) goto LAB_003e9d90;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)((long)iVar5 * 0x50 + *(long *)(this + 0x20)),0
                  );
      }
      lVar14 = lVar14 + 0x54;
    } while ((long)iVar4 * 0x54 != lVar14);
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign(const SVectorBase<S>& rhs)
{
   assert(rhs.dim() <= VectorBase<R>::dim());

   int s = rhs.size();
   num = 0;

   for(int i = 0; i < s; ++i)
   {
      int k = rhs.index(i);
      S v = rhs.value(i);

      if(isZero(v, this->tolerances()->epsilon()))
         VectorBase<R>::val[k] = 0;
      else
      {
         VectorBase<R>::val[k] = v;
         idx[num++] = k;
      }
   }

   setupStatus = true;

   assert(isConsistent());

   return *this;
}